

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeIntError DivisionHelper<long,_unsigned_int,_4>::Divide(long *t,uint *u,long *result)

{
  long *result_local;
  uint *u_local;
  long *t_local;
  undefined4 local_4;
  
  if (*u == 0) {
    local_4 = SafeIntDivideByZero;
  }
  else if (*t == 0) {
    *result = 0;
    local_4 = SafeIntNoError;
  }
  else {
    *result = *t / (long)(ulong)*u;
    local_4 = SafeIntNoError;
  }
  return local_4;
}

Assistant:

static SafeIntError Divide( const T& t, const U& u, T& result ) SAFEINT_NOTHROW
    {
        if( u == 0 )
        {
            return SafeIntDivideByZero;
        }

        if( t == 0 )
        {
            result = 0;
            return SafeIntNoError;
        }

        result = (T)( t/u );
        return SafeIntNoError;
    }